

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_reset.cc
# Opt level: O3

int runReset(string *command,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  ostream *poVar5;
  size_t __n;
  void *__buf;
  long lVar6;
  int unaff_EBP;
  DeviceInfo *device;
  pointer pDVar7;
  char *pcVar8;
  string p;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  string argv_0;
  undefined2 local_11c;
  undefined1 local_11a;
  undefined1 local_119;
  string *local_118;
  uint local_10c;
  WOL local_108;
  long local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  _Base_ptr local_e8;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_e0;
  key_type local_c8;
  DeviceFilter local_a8;
  
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No operation specified\n",0x17);
    unaff_EBP = 1;
    printHelp((ostream *)&std::cerr,command);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,*argv,(allocator<char> *)&local_108);
    iVar2 = std::__cxx11::string::compare((char *)&local_c8);
    if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_c8), iVar2 == 0)) {
      unaff_EBP = 0;
      printHelp((ostream *)&std::cout,command);
    }
    else {
      local_118 = command;
      local_e8 = (_Base_ptr)
                 std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
                 ::find(&reset_commands_abi_cxx11_._M_t,&local_c8);
      if ((_Rb_tree_header *)local_e8 ==
          &reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid operation specified\n",0x1c);
        unaff_EBP = 1;
        printHelp((ostream *)&std::cerr,local_118);
      }
      else {
        iVar2 = 1;
        local_10c = 0;
        do {
          if (argc <= iVar2) {
            if (((local_a8.mac.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_a8.mac.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) &&
                (local_a8.name.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_a8.name.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               (local_a8.serial.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_a8.serial.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"No filter set",0xd);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              unaff_EBP = 1;
              printHelp((ostream *)&std::cerr,local_118);
            }
            else {
              discoverWithFilter(&local_e0,&local_a8);
              if ((pointer)CONCAT71(local_e0.
                                    super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    local_e0.
                                    super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_) ==
                  local_e0.
                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                lVar6 = 0xf;
                pcVar8 = "No device found";
                goto LAB_00112848;
              }
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,*(char **)(local_e8 + 3),
                                  (long)local_e8[3]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5," of the following devices:\n",0x1b);
              __n = 0;
              uVar4 = 0;
              printDeviceTable((ostream *)&std::cout,&local_e0,true,false,false);
              if ((local_10c & 1) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Are you sure? [y/N] ",0x14);
                local_108 = (WOL)&local_f8;
                local_100 = 0;
                local_f8 = 0;
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&std::cin,(string *)&local_108);
                iVar2 = std::__cxx11::string::compare((char *)&local_108);
                bVar1 = true;
                if ((iVar2 != 0) &&
                   (iVar2 = std::__cxx11::string::compare((char *)&local_108), iVar2 != 0)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Cancel",6);
                  bVar1 = false;
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  unaff_EBP = 0;
                }
                if (local_108 != (WOL)&local_f8) {
                  operator_delete((void *)local_108,CONCAT71(uStack_f7,local_f8) + 1);
                }
                if (!bVar1) goto LAB_00112868;
              }
              pDVar7 = (pointer)CONCAT71(local_e0.
                                         super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_e0.
                                         super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
              lVar6 = 4;
              pcVar8 = "Done";
              if (pDVar7 != local_e0.
                            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  rcdiscover::WOL::WOL(&local_108,pDVar7->mac,9);
                  local_11c = 0xeeee;
                  local_11a = 0xee;
                  local_119 = (undefined1)local_e8[4]._M_color;
                  rcdiscover::WOL::send(&local_108,(int)&local_11c,__buf,__n,(int)uVar4);
                  pDVar7 = pDVar7 + 1;
                } while (pDVar7 != local_e0.
                                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
              }
LAB_00112848:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar6)
              ;
              unaff_EBP = 0;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_00112868:
              std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
                        (&local_e0);
            }
            break;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,argv[iVar2],(allocator<char> *)&local_e0);
          iVar2 = iVar2 + 1;
          uVar4 = std::__cxx11::string::compare((char *)&local_108);
          bVar1 = true;
          if ((int)uVar4 == 0) {
            local_10c = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_108);
            if (iVar3 == 0) {
              iVar3 = parseFilterArguments(argc - iVar2,argv + iVar2,&local_a8);
              iVar2 = iVar2 + iVar3;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_108);
              if ((iVar3 == 0) ||
                 (iVar3 = std::__cxx11::string::compare((char *)&local_108), iVar3 == 0)) {
                bVar1 = false;
                printHelp((ostream *)&std::cout,local_118);
                unaff_EBP = 0;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Invalid argument: ",0x12);
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)local_108,local_100);
                local_e0.
                super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
                _M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator<char>)0xa;
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_e0,1);
                printHelp((ostream *)&std::cerr,local_118);
                unaff_EBP = 1;
                bVar1 = false;
              }
            }
          }
          if (local_108 != (WOL)&local_f8) {
            operator_delete((void *)local_108,CONCAT71(uStack_f7,local_f8) + 1);
          }
        } while (bVar1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.model);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.iface);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.mac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.serial);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.name);
  return unaff_EBP;
}

Assistant:

int runReset(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  if (argc == 0)
  {
    std::cerr << "No operation specified\n";
    printHelp(std::cerr, command);
    return 1;
  }

  const std::string argv_0 = argv[0];
  if (argv_0 == "-h" || argv_0 == "--help")
  {
    printHelp(std::cout, command);
    return 0;
  }

  const auto reset_command = reset_commands.find(argv_0);
  if (reset_command == std::end(reset_commands))
  {
    std::cout << "Invalid operation specified\n";
    printHelp(std::cerr, command);
    return 1;
  }

  int i = 1;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }
  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  std::cout << reset_command->second.action << " of the following devices:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::WOL wol(device.getMAC(), 9);
    wol.send({{0xEE, 0xEE, 0xEE, reset_command->second.id}});
  }

  std::cout << "Done" << std::endl;

  return 0;
}